

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

bool __thiscall
iDynTree::InverseKinematics::updatePositionTarget
          (InverseKinematics *this,string *frameName,Span<const_double,__1L> targetValue,
          double positionWeight)

{
  index_type iVar1;
  undefined8 in_RCX;
  InverseKinematics *in_RDX;
  Position *in_RSI;
  string *in_RDI;
  bool ok;
  int expected_pos_size;
  double in_stack_ffffffffffffff88;
  Position local_50 [27];
  undefined1 local_35;
  undefined4 local_34;
  Position *local_28;
  InverseKinematics *local_18;
  undefined8 local_10;
  bool local_1;
  
  local_34 = 3;
  local_28 = in_RSI;
  local_18 = in_RDX;
  local_10 = in_RCX;
  iVar1 = Span<const_double,_-1L>::size((Span<const_double,__1L> *)0x16b03a);
  local_35 = iVar1 == 3;
  if ((bool)local_35) {
    iDynTree::Position::Position(local_50,local_18,local_10);
    local_1 = updatePositionTarget(local_18,in_RDI,local_28,in_stack_ffffffffffffff88);
  }
  else {
    iDynTree::reportError
              ("InverseKinematics","updatePositionTarget","Wrong size in input targetValue");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool InverseKinematics::updatePositionTarget(const std::string& frameName,
                                                 iDynTree::Span<const double> targetValue,
                                                 const double positionWeight)
    {
        constexpr int expected_pos_size = 3;
        bool ok = (targetValue.size() == expected_pos_size);
        if (!ok)
        {
            reportError("InverseKinematics",
                        "updatePositionTarget",
                        "Wrong size in input targetValue");
            return false;
        }

        return this->updatePositionTarget(frameName, Position(targetValue), positionWeight);
    }